

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

bool __thiscall wasm::I64ToI32Lowering::handleUnreachable(I64ToI32Lowering *this,Expression *curr)

{
  ulong uVar1;
  Index IVar2;
  Drop *this_00;
  Block *expression;
  Expression ***pppEVar3;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  pointer pppEVar4;
  pointer extraout_RDX_02;
  Index IVar5;
  Drop *pDVar6;
  bool bVar7;
  Index index;
  optional<wasm::Type> type;
  AbstractChildIterator<wasm::ChildIterator> local_a0;
  Drop *local_60;
  Expression *child;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> children;
  
  if ((curr->type).id == 1) {
    child = (Expression *)0x0;
    children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_a0,curr);
    index = 0;
    IVar5 = (int)((ulong)((long)local_a0.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_a0.children.flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) +
            (int)local_a0.children.usedFixed;
    if (IVar5 == 0) {
      bVar7 = false;
      pppEVar4 = extraout_RDX;
    }
    else {
      bVar7 = false;
      do {
        IVar2 = AbstractChildIterator<wasm::ChildIterator>::mapIndex(&local_a0,index);
        pppEVar3 = local_a0.children.flexible.
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar2 - 4);
        if (IVar2 < 4) {
          pppEVar3 = local_a0.children.fixed._M_elems + IVar2;
        }
        pDVar6 = (Drop *)**pppEVar3;
        uVar1 = (pDVar6->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.
                id;
        if (uVar1 < 2) {
          bVar7 = (bool)(bVar7 | uVar1 == 1);
          pppEVar4 = local_a0.children.flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        }
        else {
          local_60 = pDVar6;
          this_00 = (Drop *)MixedArena::allocSpace
                                      (&((this->builder)._M_t.
                                         super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                         .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl
                                        )->wasm->allocator,0x18,8);
          (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
               DropId;
          (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0
          ;
          this_00->value = (Expression *)pDVar6;
          Drop::finalize(this_00);
          pppEVar4 = extraout_RDX_00;
          pDVar6 = this_00;
        }
        local_60 = pDVar6;
        if (children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          _M_realloc_insert<wasm::Expression*const&>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&child,
                     (iterator)
                     children.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,(Expression **)&local_60);
          pppEVar4 = extraout_RDX_01;
        }
        else {
          *children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
           _M_impl.super__Vector_impl_data._M_start = (Expression *)pDVar6;
          children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
        index = index + 1;
      } while (IVar5 != index);
    }
    if (local_a0.children.flexible.
        super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.children.flexible.
                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.children.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      pppEVar4 = extraout_RDX_02;
    }
    if (bVar7) {
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pppEVar4;
      expression = Builder::
                   makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                             ((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                              (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                              &child,type);
      if ((expression->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id
          != 1) {
        __assert_fail("block->type == Type::unreachable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x689,"bool wasm::I64ToI32Lowering::handleUnreachable(Expression *)");
      }
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)expression);
    }
    if (child != (Expression *)0x0) {
      operator_delete(child,(long)children.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)child);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool handleUnreachable(Expression* curr) {
    if (curr->type != Type::unreachable) {
      return false;
    }
    std::vector<Expression*> children;
    bool hasUnreachable = false;
    for (auto* child : ChildIterator(curr)) {
      if (child->type.isConcrete()) {
        child = builder->makeDrop(child);
      } else if (child->type == Type::unreachable) {
        hasUnreachable = true;
      }
      children.push_back(child);
    }
    if (!hasUnreachable) {
      return false;
    }
    // This has an unreachable child, so we can replace it with
    // the children.
    auto* block = builder->makeBlock(children);
    assert(block->type == Type::unreachable);
    replaceCurrent(block);
    return true;
  }